

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::Type::ImplicitParameter> __thiscall capnp::Type::getImplicitParameter(Type *this)

{
  bool bVar1;
  Type *in_RSI;
  ImplicitParameter local_38 [4];
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Type *this_local;
  
  f.exception._6_1_ = isAnyPointer(in_RSI);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[69]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x326,FAILED,"isAnyPointer()",
               "_kjCondition,\"Type::getImplicitParameter() can only be called on AnyPointer types.\""
               ,(DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [69])"Type::getImplicitParameter() can only be called on AnyPointer types."
              );
    kj::_::Debug::Fault::fatal(&local_28);
  }
  if ((in_RSI->isImplicitParam & 1U) == 0) {
    kj::Maybe<capnp::Type::ImplicitParameter>::Maybe((Maybe<capnp::Type::ImplicitParameter> *)this);
  }
  else {
    local_38[0].index = (uint)(in_RSI->field_3).paramIndex;
    kj::Maybe<capnp::Type::ImplicitParameter>::Maybe
              ((Maybe<capnp::Type::ImplicitParameter> *)this,local_38);
  }
  return (Maybe<capnp::Type::ImplicitParameter>)(NullableValue<capnp::Type::ImplicitParameter>)this;
}

Assistant:

kj::Maybe<Type::ImplicitParameter> Type::getImplicitParameter() const {
  KJ_REQUIRE(isAnyPointer(),
      "Type::getImplicitParameter() can only be called on AnyPointer types.");

  if (isImplicitParam) {
    return ImplicitParameter { paramIndex };
  } else {
    return kj::none;
  }
}